

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

void __thiscall wasm::TypeBuilder::Impl::Impl(Impl *this,size_t n)

{
  allocator_type local_19;
  
  *(undefined8 *)((long)&(this->typeStore).mutex.super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->typeStore).mutex.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->typeStore).mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->typeStore).mutex.super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->typeStore).mutex.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->typeStore).mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (this->typeStore).constructedTypes.
  super__Vector_base<std::unique_ptr<wasm::(anonymous_namespace)::TypeInfo,_std::default_delete<wasm::(anonymous_namespace)::TypeInfo>_>,_std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::TypeInfo,_std::default_delete<wasm::(anonymous_namespace)::TypeInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->typeStore).constructedTypes.
  super__Vector_base<std::unique_ptr<wasm::(anonymous_namespace)::TypeInfo,_std::default_delete<wasm::(anonymous_namespace)::TypeInfo>_>,_std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::TypeInfo,_std::default_delete<wasm::(anonymous_namespace)::TypeInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->typeStore).constructedTypes.
  super__Vector_base<std::unique_ptr<wasm::(anonymous_namespace)::TypeInfo,_std::default_delete<wasm::(anonymous_namespace)::TypeInfo>_>,_std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::TypeInfo,_std::default_delete<wasm::(anonymous_namespace)::TypeInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->typeStore).typeIDs._M_h._M_buckets = &(this->typeStore).typeIDs._M_h._M_single_bucket;
  (this->typeStore).typeIDs._M_h._M_bucket_count = 1;
  (this->typeStore).typeIDs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->typeStore).typeIDs._M_h._M_element_count = 0;
  (this->typeStore).typeIDs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->typeStore).typeIDs._M_h._M_rehash_policy._M_next_resize = 0;
  (this->typeStore).typeIDs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->recGroups).
  super__Vector_base<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->recGroups).
  super__Vector_base<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->recGroups).
  super__Vector_base<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>::
  vector(&this->entries,n,&local_19);
  return;
}

Assistant:

Impl(size_t n) : entries(n) {}